

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int read_operands_table(Dwarf_Macro_Context macro_context,Dwarf_Small *macro_header,
                       Dwarf_Small *macro_data,Dwarf_Small *section_base,Dwarf_Unsigned section_size
                       ,Dwarf_Unsigned *table_size_out,Dwarf_Error *error)

{
  Dwarf_Debug dbg;
  byte bVar1;
  int iVar2;
  int iVar3;
  Dwarf_Macro_Forms_s *curform;
  uint uVar4;
  ulong uVar5;
  Dwarf_Small DVar6;
  ulong uVar7;
  Dwarf_Signed errval;
  int iVar8;
  Dwarf_Small *pDVar9;
  Dwarf_Small *pDVar10;
  Dwarf_Small *pDVar11;
  uint uVar12;
  bool bVar13;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned local_70;
  Dwarf_Small *local_68;
  Dwarf_Unsigned local_60;
  Dwarf_Small *local_58;
  Dwarf_Small *local_50;
  Dwarf_Small *local_48;
  ulong local_40;
  Dwarf_Unsigned *local_38;
  
  dbg = macro_context->mc_dbg;
  if (macro_context->mc_sentinel == 0xada) {
    local_68 = macro_data + 1;
    if ((ulong)((long)local_68 - (long)macro_header) < section_size) {
      pDVar11 = macro_context->mc_macro_header + macro_context->mc_total_length;
      local_70 = local_70 & 0xffffffffffffff00;
      local_50 = section_base;
      local_48 = (Dwarf_Small *)section_size;
      if (pDVar11 < local_68) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        uVar4 = 0;
      }
      else {
        (*dbg->de_copy_word)(&local_70,macro_data,1);
        uVar4 = (uint)local_70 & 0xff;
      }
      if (pDVar11 < local_68) {
        return 1;
      }
      uVar5 = (ulong)uVar4;
      DVar6 = (Dwarf_Small)uVar4;
      local_40 = uVar5;
      if (local_68 + (uVar5 * 4 - (long)local_50) < local_48) {
        pDVar9 = local_68;
        local_58 = pDVar11;
        local_38 = table_size_out;
        if (DVar6 != '\0') {
          do {
            pDVar9 = pDVar9 + 1;
            local_70 = 0;
            local_60 = 0;
            iVar2 = dwarf_decode_leb128((char *)pDVar9,&local_70,&local_60,(char *)pDVar11);
            pDVar11 = local_58;
            if (iVar2 == 1) {
              _dwarf_error_string(dbg,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
              bVar13 = false;
              pDVar11 = local_58;
            }
            else {
              pDVar10 = pDVar9 + local_70;
              bVar13 = true;
              pDVar9 = pDVar10 + local_60;
              if (local_48 <= pDVar10 + local_60 + -(long)local_50) {
                _dwarf_error(dbg,error,0x13e);
                bVar13 = false;
                pDVar9 = pDVar10;
              }
            }
            if (!bVar13) {
              return 1;
            }
            uVar12 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar12;
          } while (uVar12 != 0);
        }
        curform = (Dwarf_Macro_Forms_s *)calloc((ulong)uVar4,0x10);
        macro_context->mc_opcode_forms = curform;
        macro_context->mc_opcode_count = DVar6;
        if (curform != (Dwarf_Macro_Forms_s *)0x0) {
          pDVar11 = local_68;
          if (DVar6 != '\0') {
            iVar2 = 1;
            iVar8 = 0;
            pDVar9 = local_68;
            do {
              if (pDVar9 + (2 - (long)local_50) < local_48) {
                local_70 = local_70 & 0xffffffffffffff00;
                pDVar11 = pDVar9 + 1;
                if (local_58 < pDVar11) {
                  _dwarf_error_string(dbg,error,0x14b,
                                      "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                                     );
                  iVar2 = 1;
                  bVar1 = 0;
                }
                else {
                  (*dbg->de_copy_word)(&local_70,pDVar9,1);
                  bVar1 = (byte)local_70;
                }
                if (local_58 < pDVar11) {
                  bVar13 = false;
                  pDVar11 = pDVar9;
                }
                else {
                  local_70 = 0;
                  local_60 = 0;
                  iVar3 = dwarf_decode_leb128((char *)pDVar11,&local_70,&local_60,(char *)local_58);
                  if (iVar3 == 1) {
                    _dwarf_error_string(dbg,error,0x149,
                                        "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c")
                    ;
                    iVar2 = 1;
LAB_0017af0d:
                    bVar13 = false;
                  }
                  else {
                    pDVar9 = pDVar11 + local_70;
                    curform->mf_code = bVar1;
                    curform->mf_formcount = (Dwarf_Small)local_60;
                    pDVar11 = pDVar9 + local_60;
                    if (pDVar11 + -(long)local_50 < local_48) {
                      curform->mf_formbytes = pDVar9;
                      if (0xc < bVar1) {
                        bVar13 = local_60 != 0;
                        if (bVar13) {
                          uVar5 = 1;
                          uVar7 = 0;
                          do {
                            bVar1 = pDVar9[uVar7];
                            if ((0xc < bVar1 - 3) &&
                               ((0x1e < bVar1 || ((0x44800000U >> (bVar1 & 0x1f) & 1) == 0)))) {
                              _dwarf_error(dbg,error,0x144);
                              iVar2 = 1;
                              break;
                            }
                            uVar7 = uVar5 & 0xffff;
                            uVar5 = (ulong)((int)uVar5 + 1);
                            bVar13 = uVar7 < local_60;
                          } while (uVar7 < local_60);
                        }
                        if (bVar13) goto LAB_0017af0d;
                      }
                      iVar3 = validate_opcode(macro_context->mc_dbg,curform,error);
                      bVar13 = iVar3 == 0;
                      if (!bVar13) {
                        iVar2 = iVar3;
                      }
                    }
                    else {
                      _dwarf_error(dbg,error,0x13e);
                      bVar13 = false;
                      pDVar11 = pDVar9;
                      iVar2 = 1;
                    }
                  }
                }
              }
              else {
                _dwarf_error(dbg,error,0x13e);
                bVar13 = false;
                pDVar11 = pDVar9;
                iVar2 = 1;
              }
              if (!bVar13) {
                return iVar2;
              }
              iVar8 = iVar8 + 1;
              curform = curform + 1;
              pDVar9 = pDVar11;
            } while (iVar8 != (int)local_40);
          }
          *local_38 = (long)pDVar11 - (long)local_68;
          return 0;
        }
        errval = 0x3e;
      }
      else {
        errval = 0x13e;
      }
      _dwarf_error(dbg,error,errval);
      return 1;
    }
    _dwarf_error(dbg,error,0x13e);
  }
  else {
    _dwarf_error_string(dbg,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
  }
  return 1;
}

Assistant:

static int
read_operands_table(Dwarf_Macro_Context macro_context,
    Dwarf_Small * macro_header,
    Dwarf_Small * macro_data,
    Dwarf_Small * section_base,
    Dwarf_Unsigned section_size,
    Dwarf_Unsigned *table_size_out,
    Dwarf_Error *error)
{
    Dwarf_Small* table_data_start = macro_data;
    Dwarf_Unsigned local_size = 0;
    Dwarf_Unsigned cur_offset = 0;
    Dwarf_Small operand_table_count = 0;
    unsigned i = 0;
    struct Dwarf_Macro_Forms_s *curformentry = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Byte_Ptr startptr = 0;
    Dwarf_Byte_Ptr endptr = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    cur_offset = (1+ macro_data) - macro_header;
    if (cur_offset >= section_size) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
        return DW_DLV_ERROR;
    }

    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    READ_UNALIGNED_CK(dbg,operand_table_count,Dwarf_Small,
        macro_data,sizeof(Dwarf_Small),error,endptr);
    macro_data += sizeof(Dwarf_Small);
    /* Estimating minimum size */
    local_size = operand_table_count * 4;

    cur_offset = (local_size+ macro_data) - section_base;
    if (cur_offset >= section_size) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
        return DW_DLV_ERROR;
    }
    /* first, get size of table. */
    table_data_start = macro_data;
    for (i = 0; i < operand_table_count; ++i) {
        /*  Compiler warning about unused opcode_number
            variable should be ignored. */
        Dwarf_Unsigned formcount = 0;
#if 0   /* No need to actually read, just update pointer*/
        Dwarf_Small opcode_number = 0;
        READ_UNALIGNED_CK(dbg,opcode_number,Dwarf_Small,
            macro_data,sizeof(Dwarf_Small),error,endptr);
#endif /*0*/
        macro_data += sizeof(Dwarf_Small);

        DECODE_LEB128_UWORD_CK(macro_data,formcount,
            dbg, error, endptr);
        cur_offset = (formcount+ macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        /* The 1 ubyte forms follow. Step past them. */
        macro_data += formcount;
    }
    /* reset for reread. */
    macro_data = table_data_start;
    /* allocate table */
    macro_context->mc_opcode_forms =  (struct Dwarf_Macro_Forms_s *)
        calloc(operand_table_count,
            sizeof(struct Dwarf_Macro_Forms_s));
    macro_context->mc_opcode_count = operand_table_count;
    if (!macro_context->mc_opcode_forms) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    curformentry = macro_context->mc_opcode_forms;
    for (i = 0; i < operand_table_count; ++i,++curformentry) {
        Dwarf_Small opcode_number = 0;
        Dwarf_Unsigned formcount = 0;
        int res = 0;

        cur_offset = (2 + macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        READ_UNALIGNED_CK(dbg,opcode_number,Dwarf_Small,
            macro_data,sizeof(Dwarf_Small),
            error,endptr);
        macro_data += sizeof(Dwarf_Small);
        DECODE_LEB128_UWORD_CK(macro_data,formcount,
            dbg, error, endptr);

        curformentry->mf_code = opcode_number;
        curformentry->mf_formcount = (Dwarf_Small)formcount;

        cur_offset = (formcount+ macro_data) - section_base;
        if (cur_offset >= section_size) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OFFSET_BAD);
            return DW_DLV_ERROR;
        }
        curformentry->mf_formbytes = macro_data;
        macro_data += formcount;
        if (opcode_number  > DW_MACRO_undef_strx ) {
            Dwarf_Half k = 0;
            for (k = 0; k < formcount; ++k) {
                if (!valid_macro_form(
                    curformentry->mf_formbytes[k])) {
                    _dwarf_error(dbg, error,
                        DW_DLE_MACRO_OP_UNHANDLED);
                    return DW_DLV_ERROR;
                }
            }
        }
        res = validate_opcode(macro_context->mc_dbg,
            curformentry, error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    *table_size_out = macro_data - table_data_start;
    return DW_DLV_OK;
}